

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O0

void us_poll_start(us_poll_t *p,us_loop_t *loop,int events)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint in_EDX;
  long in_RSI;
  us_poll_t *in_RDI;
  epoll_event event;
  undefined1 local_20 [16];
  long local_10;
  us_poll_t *local_8;
  
  local_20._12_4_ = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar1 = us_internal_poll_type(in_RDI);
  uVar2 = 0;
  if ((local_20._12_4_ & 1) != 0) {
    uVar2 = 8;
  }
  uVar3 = 0;
  if ((local_20._12_4_ & 4) != 0) {
    uVar3 = 4;
  }
  local_8->state =
       (anon_struct_4_2_c726803f_for_state)
       ((uint)local_8->state & 0xfffffff | (uVar1 | uVar2 | uVar3) << 0x1c);
  local_20._0_4_ = local_20._12_4_;
  local_20._4_8_ = local_8;
  epoll_ctl(*(int *)(local_10 + 100),1,((int)local_8->state << 4) >> 4,(epoll_event *)local_20);
  return;
}

Assistant:

void us_poll_start(struct us_poll_t *p, struct us_loop_t *loop, int events) {
    p->state.poll_type = us_internal_poll_type(p) | ((events & LIBUS_SOCKET_READABLE) ? POLL_TYPE_POLLING_IN : 0) | ((events & LIBUS_SOCKET_WRITABLE) ? POLL_TYPE_POLLING_OUT : 0);

#ifdef LIBUS_USE_EPOLL
    struct epoll_event event;
    event.events = events;
    event.data.ptr = p;
    epoll_ctl(loop->fd, EPOLL_CTL_ADD, p->state.fd, &event);
#else
    kqueue_change(loop->fd, p->state.fd, 0, events, p);
#endif
}